

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::iterate
          (TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize *this)

{
  ostringstream *poVar1;
  float *pfVar2;
  _vec4 *this_00;
  pointer p_Var3;
  _ivec4 *this_01;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  MessageBuilder *pMVar8;
  TestError *this_02;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  pointer p_Var14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float local_208;
  GLint shader_id_te;
  GLint shader_id_tc;
  GLint shader_type_te;
  _ivec4 local_1f8;
  _vec4 local_1e8;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  GLint shader_type_tc;
  ostringstream local_1a8 [376];
  long lVar7;
  undefined1 auVar23 [16];
  
  initTest(this);
  fVar15 = 0.0;
  fVar16 = 0.0;
  fVar17 = 0.0;
  fVar18 = 0.0;
  local_1e8.x = 0.0;
  local_1e8.y = 0.0;
  local_1e8.z = 0.0;
  local_1e8.w = 0.0;
  local_1f8.x = 0;
  local_1f8.y = 0;
  local_1f8.z = 0;
  iVar5 = this->m_gl_max_patch_vertices_value;
  iVar9 = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  local_208 = 0.0;
  iVar11 = 0;
  iVar12 = 0;
  local_1f8.w = 0;
  fVar19 = 0.0;
  local_1d8 = 0.0;
  fStack_1d4 = 0.0;
  fStack_1d0 = 0.0;
  fStack_1cc = 0.0;
  iVar13 = 0;
  for (iVar10 = 2; iVar10 - iVar5 != 2; iVar10 = iVar10 + 1) {
    auVar20._4_4_ = iVar9;
    auVar20._0_4_ = iVar9;
    auVar20._8_8_ = 0;
    auVar20 = auVar20 | ZEXT816(0x300000002);
    auVar21._4_12_ = auVar20._4_12_;
    auVar21._0_4_ = (float)(iVar13 + 2);
    fVar15 = fVar15 + (float)iVar9;
    fVar16 = fVar16 + (float)(iVar9 + 1);
    fVar17 = fVar17 + (float)auVar20._0_4_;
    fVar18 = fVar18 + (float)auVar20._4_4_;
    local_1e8.y = fVar16;
    local_1e8.x = fVar15;
    local_1e8.w = fVar18;
    local_1e8.z = fVar17;
    auVar23._0_8_ = auVar21._0_8_;
    auVar23._8_4_ = auVar20._4_4_;
    auVar23._12_4_ = fVar19;
    auVar22._8_8_ = auVar23._8_8_;
    auVar22._4_4_ = (float)(iVar13 + 1);
    auVar22._0_4_ = auVar21._0_4_;
    auVar20 = divps(_DAT_01675880,auVar22);
    local_1d8 = local_1d8 + auVar20._0_4_;
    fVar19 = auVar20._4_4_;
    fStack_1d4 = fStack_1d4 + fVar19;
    fStack_1d0 = fStack_1d0 + auVar20._8_4_;
    fStack_1cc = fStack_1cc + auVar20._12_4_;
    local_208 = local_208 + fVar19;
    iVar12 = iVar12 + iVar10 + -1;
    iVar11 = iVar11 + iVar10;
    local_1f8.y = iVar11;
    local_1f8.x = iVar12;
    local_1f8.z = local_1f8.z + iVar10 + 1;
    local_1f8.w = local_1f8.w + iVar10 + 2;
    iVar9 = iVar9 + 4;
    iVar13 = iVar13 + 1;
  }
  p_Var14 = (this->m_runs).
            super__Vector_base<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run,_std::allocator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1c8 = fStack_1d4;
  fStack_1c4 = fStack_1d4;
  fStack_1c0 = fStack_1d4;
  fStack_1bc = fStack_1d4;
  do {
    if (p_Var14 ==
        (this->m_runs).
        super__Vector_base<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run,_std::allocator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    if (p_Var14 ==
        (this->m_runs).
        super__Vector_base<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run,_std::allocator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      iVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      lVar7 = CONCAT44(extraout_var,iVar5);
      _shader_type_tc = (TestLog *)((ulong)_shader_type_tc & 0xffffffff00000000);
      shader_type_te = 0;
      (**(code **)(lVar7 + 0xa70))(p_Var14->tc_id,0x8b4f,&shader_type_tc);
      (**(code **)(lVar7 + 0xa70))(p_Var14->te_id,0x8b4f,&shader_type_te);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"glGetShaderiv() call(s) failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xbc4);
      if (shader_type_tc != (this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,
                   "Invalid shader type reported by glGetShaderiv() for a tessellation control shader"
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                   ,0xbc8);
        goto LAB_00d1e4d0;
      }
      if (shader_type_te != (this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,
                   "Invalid shader type reported by glGetShaderiv() for a tessellation evaluation shader"
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                   ,0xbcd);
        goto LAB_00d1e4d0;
      }
      shader_id_tc = 0;
      shader_id_te = 0;
      (**(code **)(lVar7 + 0x9a0))
                (p_Var14->pipeline_object_id,(ulong)_shader_type_tc & 0xffffffff,&shader_id_tc);
      (**(code **)(lVar7 + 0x9a0))
                (p_Var14->pipeline_object_id,
                 (this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER,&shader_id_te);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,
                      "glGetProgramPipelineiv() failed for GL_TESS_CONTROL_SHADER_EXT / GL_TESS_EVALUATION_SHADER_EXT enum(s)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xbd8);
      if (shader_id_tc != p_Var14->tc_program_id) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,
                   "Invalid separate program object ID reported for Tessellation Control stage",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                   ,0xbdc);
        goto LAB_00d1e4d0;
      }
      if (shader_id_te != p_Var14->te_program_id) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,
                   "Invalid separate program object ID reported for Tessellation Evaluation stage",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                   ,0xbe1);
        goto LAB_00d1e4d0;
      }
    }
    if (p_Var14->point_mode == true) {
      pfVar2 = (p_Var14->result_pointsize_data).super__Vector_base<float,_std::allocator<float>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((long)(p_Var14->result_pointsize_data).super__Vector_base<float,_std::allocator<float>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pfVar2 == 4) {
        fVar16 = *pfVar2 - local_1c8;
        fVar15 = -fVar16;
        if (-fVar16 <= fVar16) {
          fVar15 = fVar16;
        }
        if (fVar15 <= 1e-05) goto LAB_00d1deaa;
      }
      _shader_type_tc = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::operator<<((ostream *)local_1a8,
                      "Tessellation Evaluation stage set gl_PointSize value to ");
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&shader_type_tc,
                          (p_Var14->result_pointsize_data).
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
      std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      " instead of expected value ");
      std::ostream::operator<<(&pMVar8->m_str,local_1c8);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      this_02 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_02,"Invalid gl_PointSize data exposed in TE stage",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                 ,0xbef);
      goto LAB_00d1e4d0;
    }
LAB_00d1deaa:
    this_00 = (p_Var14->result_position_data).
              super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((long)(p_Var14->result_position_data).
              super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)this_00 != 0x10) {
LAB_00d1e08a:
      _shader_type_tc = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::operator<<((ostream *)local_1a8,"Tessellation Evaluation stage set gl_Position to ");
      std::operator<<((ostream *)local_1a8," (");
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&shader_type_tc,
                          &((p_Var14->result_position_data).
                            super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>._M_impl.
                            super__Vector_impl_data._M_start)->x);
      std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar8 = tcu::MessageBuilder::operator<<
                         (pMVar8,&((p_Var14->result_position_data).
                                   super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->y);
      std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar8 = tcu::MessageBuilder::operator<<
                         (pMVar8,&((p_Var14->result_position_data).
                                   super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->z);
      std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar8 = tcu::MessageBuilder::operator<<
                         (pMVar8,&((p_Var14->result_position_data).
                                   super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->w);
      poVar1 = &pMVar8->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      " ) instead of expected value (");
      std::ostream::operator<<(poVar1,local_1e8.x);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
      std::ostream::operator<<(poVar1,local_1e8.y);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
      std::ostream::operator<<(poVar1,local_1e8.z);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
      std::ostream::operator<<(poVar1,local_1e8.w);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,")");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      this_02 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_02,"Invalid gl_Position data exposed in TE stage",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                 ,0xc00);
LAB_00d1e4d0:
      __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    bVar4 = _vec4::operator!=(this_00,&local_1e8);
    if (bVar4) goto LAB_00d1e08a;
    p_Var3 = (p_Var14->result_value1_data).
             super__Vector_base<glcts::_vec2,_std::allocator<glcts::_vec2>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(p_Var14->result_value1_data).
              super__Vector_base<glcts::_vec2,_std::allocator<glcts::_vec2>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)p_Var3 != 8) {
LAB_00d1df89:
      _shader_type_tc = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::operator<<((ostream *)local_1a8,"Tessellation Evaluation stage set te_value1 to ");
      std::operator<<((ostream *)local_1a8," (");
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&shader_type_tc,
                          &((p_Var14->result_value1_data).
                            super__Vector_base<glcts::_vec2,_std::allocator<glcts::_vec2>_>._M_impl.
                            super__Vector_impl_data._M_start)->x);
      std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar8 = tcu::MessageBuilder::operator<<
                         (pMVar8,&((p_Var14->result_value1_data).
                                   super__Vector_base<glcts::_vec2,_std::allocator<glcts::_vec2>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->y);
      poVar1 = &pMVar8->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      " ) instead of expected value (");
      std::ostream::operator<<(poVar1,local_208);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
      std::ostream::operator<<(poVar1,local_1d8);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,")");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      this_02 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_02,"Invalid gl_Position data exposed in TE stage",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                 ,0xc11);
      goto LAB_00d1e4d0;
    }
    fVar16 = p_Var3->x - local_208;
    fVar15 = -fVar16;
    if (-fVar16 <= fVar16) {
      fVar15 = fVar16;
    }
    if (1e-05 < fVar15) goto LAB_00d1df89;
    fVar16 = p_Var3->y - local_1d8;
    fVar15 = -fVar16;
    if (-fVar16 <= fVar16) {
      fVar15 = fVar16;
    }
    if (1e-05 < fVar15) goto LAB_00d1df89;
    this_01 = (p_Var14->result_value2_data).
              super__Vector_base<glcts::_ivec4,_std::allocator<glcts::_ivec4>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((long)(p_Var14->result_value2_data).
              super__Vector_base<glcts::_ivec4,_std::allocator<glcts::_ivec4>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)this_01 != 0x10) {
LAB_00d1e207:
      _shader_type_tc = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::operator<<((ostream *)local_1a8,"Tessellation Evaluation stage set te_value2 to ");
      std::operator<<((ostream *)local_1a8," (");
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&shader_type_tc,
                          &((p_Var14->result_value2_data).
                            super__Vector_base<glcts::_ivec4,_std::allocator<glcts::_ivec4>_>.
                            _M_impl.super__Vector_impl_data._M_start)->x);
      std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar8 = tcu::MessageBuilder::operator<<
                         (pMVar8,&((p_Var14->result_value2_data).
                                   super__Vector_base<glcts::_ivec4,_std::allocator<glcts::_ivec4>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->y);
      std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar8 = tcu::MessageBuilder::operator<<
                         (pMVar8,&((p_Var14->result_value2_data).
                                   super__Vector_base<glcts::_ivec4,_std::allocator<glcts::_ivec4>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->z);
      std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar8 = tcu::MessageBuilder::operator<<
                         (pMVar8,&((p_Var14->result_value2_data).
                                   super__Vector_base<glcts::_ivec4,_std::allocator<glcts::_ivec4>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->w);
      poVar1 = &pMVar8->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      " ) instead of expected value (");
      std::ostream::operator<<(poVar1,local_1f8.x);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
      std::ostream::operator<<(poVar1,local_1f8.y);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
      std::ostream::operator<<(poVar1,local_1f8.z);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
      std::ostream::operator<<(poVar1,local_1f8.w);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,")");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      this_02 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_02,"Invalid value2 data saved in TE stage",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                 ,0xc22);
      goto LAB_00d1e4d0;
    }
    bVar4 = _ivec4::operator!=(this_01,&local_1f8);
    if (bVar4) goto LAB_00d1e207;
    p_Var14 = p_Var14 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::iterate(void)
{
	/* Initialize ES test objects */
	initTest();

	/* Calculate reference values that should be generated for all runs */
	float		reference_result_pointsize(0);
	_vec4		reference_result_position(0, 0, 0, 0);
	_vec2		reference_result_value1(0, 0);
	_ivec4		reference_result_value2(0, 0, 0, 0);
	const float epsilon = (float)1e-5;

	for (glw::GLint n_invocation = 0; n_invocation < m_gl_max_patch_vertices_value; ++n_invocation)
	{
		/* As per TC and TE shaders */
		reference_result_pointsize += 1.0f / static_cast<float>(n_invocation + 1);

		reference_result_position.x += static_cast<float>(n_invocation * 4 + 0);
		reference_result_position.y += static_cast<float>(n_invocation * 4 + 1);
		reference_result_position.z += static_cast<float>(n_invocation * 4 + 2);
		reference_result_position.w += static_cast<float>(n_invocation * 4 + 3);

		reference_result_value1.x += 1.0f / static_cast<float>(n_invocation + 1);
		reference_result_value1.y += 1.0f / static_cast<float>(n_invocation + 2);

		reference_result_value2.x += (n_invocation + 1);
		reference_result_value2.y += (n_invocation + 2);
		reference_result_value2.z += (n_invocation + 3);
		reference_result_value2.w += (n_invocation + 4);
	}

	/* Iterate through test runs and analyse the result data */
	for (_runs_const_iterator run_iterator = m_runs.begin(); run_iterator != m_runs.end(); run_iterator++)
	{
		const _run& run = *run_iterator;

		/* For the very first run, make sure that the type of tessellation shader objects
		 * is reported correctly for both program and pipeline object cases.
		 */
		if (run_iterator == m_runs.begin())
		{
			const glw::Functions& gl			 = m_context.getRenderContext().getFunctions();
			glw::GLint			  shader_type_tc = GL_NONE;
			glw::GLint			  shader_type_te = GL_NONE;

			/* Program objects first */
			gl.getShaderiv(run.tc_id, GL_SHADER_TYPE, &shader_type_tc);
			gl.getShaderiv(run.te_id, GL_SHADER_TYPE, &shader_type_te);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call(s) failed");

			if ((glw::GLenum)shader_type_tc != m_glExtTokens.TESS_CONTROL_SHADER)
			{
				TCU_FAIL("Invalid shader type reported by glGetShaderiv() for a tessellation control shader");
			}

			if ((glw::GLenum)shader_type_te != m_glExtTokens.TESS_EVALUATION_SHADER)
			{
				TCU_FAIL("Invalid shader type reported by glGetShaderiv() for a tessellation evaluation shader");
			}

			/* Let's query the pipeline object now */
			glw::GLint shader_id_tc = 0;
			glw::GLint shader_id_te = 0;

			gl.getProgramPipelineiv(run.pipeline_object_id, m_glExtTokens.TESS_CONTROL_SHADER, &shader_id_tc);
			gl.getProgramPipelineiv(run.pipeline_object_id, m_glExtTokens.TESS_EVALUATION_SHADER, &shader_id_te);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramPipelineiv() failed for GL_TESS_CONTROL_SHADER_EXT / "
											   "GL_TESS_EVALUATION_SHADER_EXT enum(s)");

			if ((glw::GLuint)shader_id_tc != run.tc_program_id)
			{
				TCU_FAIL("Invalid separate program object ID reported for Tessellation Control stage");
			}

			if ((glw::GLuint)shader_id_te != run.te_program_id)
			{
				TCU_FAIL("Invalid separate program object ID reported for Tessellation Evaluation stage");
			}
		}

		if ((run.point_mode && run.result_pointsize_data.size() != 1) ||
			(run.point_mode && de::abs(run.result_pointsize_data[0] - reference_result_pointsize) > epsilon))
		{
			/* It is a test bug if result_pointsize_data.size() == 0 */
			DE_ASSERT(run.result_pointsize_data.size() > 0);

			m_testCtx.getLog() << tcu::TestLog::Message << "Tessellation Evaluation stage set gl_PointSize value to "
							   << run.result_pointsize_data[0] << " instead of expected value "
							   << reference_result_pointsize << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid gl_PointSize data exposed in TE stage");
		}

		if (run.result_position_data.size() != 1 || run.result_position_data[0] != reference_result_position)
		{
			/* It is a test bug if result_position_data.size() == 0 */
			DE_ASSERT(run.result_position_data.size() > 0);

			m_testCtx.getLog() << tcu::TestLog::Message << "Tessellation Evaluation stage set gl_Position to "
							   << " (" << run.result_position_data[0].x << ", " << run.result_position_data[0].y << ", "
							   << run.result_position_data[0].z << ", " << run.result_position_data[0].w
							   << " ) instead of expected value"
								  " ("
							   << reference_result_position.x << ", " << reference_result_position.y << ", "
							   << reference_result_position.z << ", " << reference_result_position.w << ")"
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid gl_Position data exposed in TE stage");
		}

		if (run.result_value1_data.size() != 1 ||
			de::abs(run.result_value1_data[0].x - reference_result_value1.x) > epsilon ||
			de::abs(run.result_value1_data[0].y - reference_result_value1.y) > epsilon)
		{
			/* It is a test bug if result_value1_data.size() == 0 */
			DE_ASSERT(run.result_value1_data.size() > 0);

			m_testCtx.getLog() << tcu::TestLog::Message << "Tessellation Evaluation stage set te_value1 to "
							   << " (" << run.result_value1_data[0].x << ", " << run.result_value1_data[0].y
							   << " ) instead of expected value"
								  " ("
							   << reference_result_value1.x << ", " << reference_result_value1.y << ")"
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid gl_Position data exposed in TE stage");
		}

		if (run.result_value2_data.size() != 1 || run.result_value2_data[0] != reference_result_value2)
		{
			/* It is a test bug if result_value2_data.size() == 0 */
			DE_ASSERT(run.result_value2_data.size() > 0);

			m_testCtx.getLog() << tcu::TestLog::Message << "Tessellation Evaluation stage set te_value2 to "
							   << " (" << run.result_value2_data[0].x << ", " << run.result_value2_data[0].y << ", "
							   << run.result_value2_data[0].z << ", " << run.result_value2_data[0].w
							   << " ) instead of expected value"
								  " ("
							   << reference_result_value2.x << ", " << reference_result_value2.y << ", "
							   << reference_result_value2.z << ", " << reference_result_value2.w << ")"
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value2 data saved in TE stage");
		}
	} /* for (all runs) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}